

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O3

int libssh2_knownhost_get
              (LIBSSH2_KNOWNHOSTS *hosts,libssh2_knownhost **ext,libssh2_knownhost *oprev)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  
  if ((oprev == (libssh2_knownhost *)0x0) || ((list_node *)oprev->node == (list_node *)0x0)) {
    pvVar1 = _libssh2_list_first(&hosts->head);
  }
  else {
    pvVar1 = _libssh2_list_next((list_node *)oprev->node);
  }
  if (pvVar1 == (void *)0x0) {
    iVar2 = 1;
  }
  else {
    *(undefined4 *)((long)pvVar1 + 0x68) = 0xdeadcafe;
    *(void **)((long)pvVar1 + 0x70) = pvVar1;
    iVar2 = 0;
    if ((short)*(undefined4 *)((long)pvVar1 + 0x2c) == 1) {
      uVar3 = *(undefined8 *)((long)pvVar1 + 0x18);
    }
    else {
      uVar3 = 0;
    }
    *(undefined8 *)((long)pvVar1 + 0x78) = uVar3;
    *(undefined8 *)((long)pvVar1 + 0x80) = *(undefined8 *)((long)pvVar1 + 0x40);
    *(undefined4 *)((long)pvVar1 + 0x88) = *(undefined4 *)((long)pvVar1 + 0x2c);
    *ext = (libssh2_knownhost *)((long)pvVar1 + 0x68);
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_get(LIBSSH2_KNOWNHOSTS *hosts,
                      struct libssh2_knownhost **ext,
                      struct libssh2_knownhost *oprev)
{
    struct known_host *node;
    if(oprev && oprev->node) {
        /* we have a starting point */
        struct known_host *prev = oprev->node;

        /* get the next node in the list */
        node = _libssh2_list_next(&prev->node);

    }
    else
        node = _libssh2_list_first(&hosts->head);

    if(!node)
        /* no (more) node */
        return 1;

    *ext = knownhost_to_external(node);

    return 0;
}